

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O0

Matrix4x4 * CMU462::outer(Matrix4x4 *__return_storage_ptr__,Vector4D *u,Vector4D *v)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  int local_28;
  int local_24;
  int j;
  int i;
  Vector4D *v_local;
  Vector4D *u_local;
  Matrix4x4 *B;
  
  _j = v;
  v_local = u;
  u_local = __return_storage_ptr__->entries;
  Matrix4x4::Matrix4x4(__return_storage_ptr__);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 4; local_28 = local_28 + 1) {
      pdVar3 = Vector4D::operator[](v_local,&local_24);
      dVar1 = *pdVar3;
      pdVar3 = Vector4D::operator[](_j,&local_28);
      dVar2 = *pdVar3;
      pdVar3 = Matrix4x4::operator()(__return_storage_ptr__,local_24,local_28);
      *pdVar3 = dVar1 * dVar2;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix4x4 outer( const Vector4D& u, const Vector4D& v ) {
    Matrix4x4 B;

    // Opposite of an inner product.
    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       B( i, j ) = u[i]*v[j];
    }

    return B;
  }